

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xds.c
# Opt level: O0

int xds_decode(xds_t *xds,uint16_t cc)

{
  byte bVar1;
  byte bVar2;
  ushort in_SI;
  int *in_RDI;
  int local_4;
  
  bVar1 = (byte)in_SI;
  bVar2 = (byte)(in_SI >> 8);
  if ((*in_RDI == 0) || (*in_RDI != 1)) {
    xds_init((xds_t *)0x10bae7);
    *(byte *)(in_RDI + 1) = bVar2 & 0xf;
    *(byte *)((long)in_RDI + 5) = bVar1 & 0xf;
    *in_RDI = 1;
    local_4 = 1;
  }
  else if ((in_SI & 0xff00) == 0x8f00) {
    *(byte *)(in_RDI + 0xb) = bVar1 & 0x7f;
    *in_RDI = 0;
    local_4 = 2;
  }
  else if ((uint)in_RDI[2] < 0x20) {
    *(byte *)((long)in_RDI + (ulong)(uint)in_RDI[2] + 0xc) = bVar2 & 0x7f;
    *(byte *)((long)in_RDI + (ulong)(in_RDI[2] + 1) + 0xc) = bVar1 & 0x7f;
    in_RDI[2] = in_RDI[2] + 2;
    local_4 = 1;
  }
  else {
    *in_RDI = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int xds_decode(xds_t* xds, uint16_t cc)
{
    switch (xds->state) {
    default:
    case 0:
        xds_init(xds);
        xds->class_code = (cc & 0x0F00) >> 8;
        xds->type = (cc & 0x000F);
        xds->state = 1;
        return LIBCAPTION_OK;

    case 1:
        if (0x8F00 == (cc & 0xFF00)) {
            xds->checksum = (cc & 0x007F);
            xds->state = 0;
            return LIBCAPTION_READY;
        }

        if (xds->size < 32) {
            xds->content[xds->size + 0] = (cc & 0x7F00) >> 8;
            xds->content[xds->size + 1] = (cc & 0x007F);
            xds->size += 2;
            return LIBCAPTION_OK;
        }
    }

    xds->state = 0;
    return LIBCAPTION_ERROR;
}